

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  pointer pbVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  undefined7 extraout_var;
  char *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  long lVar13;
  string *psVar14;
  LinkClosure *pLVar15;
  long *plVar16;
  size_type *psVar17;
  ulong *puVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  byte bVar21;
  pointer pbVar22;
  bool bVar23;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  string d;
  string suffix;
  string rootPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string targetOutputDir;
  string local_190;
  byte local_16e;
  byte local_16d;
  undefined4 local_16c;
  string local_168;
  string local_148;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_128;
  string *local_120;
  undefined1 local_118 [32];
  _Base_ptr local_f8;
  size_t local_f0;
  string *local_e8;
  string *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  pcVar4 = local_118 + 0x10;
  local_128 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  local_118._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CMAKE_SKIP_RPATH","");
  bVar7 = cmMakefile::IsOn(pcVar2,(string *)local_118);
  bVar23 = (this->RuntimeFlag)._M_string_length == 0;
  if ((pointer)local_118._0_8_ != pcVar4) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  bVar8 = true;
  if (!for_install) {
    pcVar3 = this->Target;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"BUILD_WITH_INSTALL_RPATH","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_50);
  }
  if ((!for_install) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar7 || bVar23) {
    bVar10 = 0;
    bVar21 = 0;
  }
  else {
    bVar9 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar10 = bVar9 & bVar8;
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar21 = (bVar8 ^ 1U) & bVar9;
  }
  if ((bVar7 || bVar23) || (bVar8 ^ 1U) != 0) {
LAB_0029ae38:
    bVar9 = false;
    local_16c = 0;
  }
  else {
    pcVar2 = this->Makefile;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar9 = cmMakefile::IsOn(pcVar2,&local_b0);
    if (bVar9) goto LAB_0029ae38;
    pcVar3 = this->Target;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"INSTALL_RPATH_USE_LINK_PATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_70);
    local_16c = (undefined4)CONCAT71(extraout_var,bVar9);
    bVar9 = true;
  }
  if ((bVar9) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (((!bVar7 && !bVar23) && (bVar8 ^ 1U) == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  local_118._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  local_e8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar4) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  psVar14 = &this->Config;
  cmGeneratorTarget::GetDirectory(&local_90,this->Target,psVar14,RuntimeBinaryArtifact);
  pcVar3 = this->Target;
  local_118._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"BUILD_RPATH_USE_ORIGIN","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_118);
  local_16d = local_e8->_M_string_length != 0;
  local_16e = local_90._M_string_length != 0;
  if ((pointer)local_118._0_8_ != pcVar4) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._24_8_ = local_118 + 8;
  local_118._8_4_ = _S_red;
  local_118._16_8_ = 0;
  local_f0 = 0;
  paVar1 = &local_148.field_2;
  local_f8 = (_Base_ptr)local_118._24_8_;
  if (bVar10 != 0) {
    pcVar3 = this->Target;
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INSTALL_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar3,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    cmCLI_ExpandListUnique
              (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_128,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118);
  }
  if (bVar21 == 0) {
    if ((char)local_16c == '\0') goto LAB_0029b7ae;
  }
  else {
    pcVar3 = this->Target;
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BUILD_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar3,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (pcVar11 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_128,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118);
    }
    if (bVar21 == 0 && (char)local_16c == '\0') goto LAB_0029b7ae;
  }
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity =
       local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar2 = this->Makefile;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"CMAKE_SYSROOT_LINK","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  sVar6 = local_148._M_string_length;
  local_b8 = psVar14;
  if (pcVar11 == (char *)0x0) {
    pcVar2 = this->Makefile;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar2,&local_190);
    std::__cxx11::string::_M_assign((string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)sVar6,(ulong)pcVar11);
  }
  pcVar2 = this->Makefile;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"CMAKE_STAGING_PREFIX","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"CMAKE_INSTALL_PREFIX","");
  local_e0 = cmMakefile::GetSafeDefinition(pcVar2,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_148);
  pvVar12 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
  local_120 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pbVar22 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar5) {
    bVar10 = bVar7 & local_16e & local_16d;
    do {
      if (bVar21 == 0) {
        if ((char)local_16c != '\0') {
          psVar14 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
          bVar7 = cmsys::SystemTools::ComparePath(pbVar22,psVar14);
          if ((((!bVar7) && (bVar7 = cmsys::SystemTools::ComparePath(pbVar22,local_120), !bVar7)) &&
              (bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar22,psVar14), !bVar7)) &&
             (bVar7 = cmsys::SystemTools::IsSubDirectory(pbVar22,local_120), !bVar7)) {
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            pcVar4 = (pbVar22->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,pcVar4,pcVar4 + pbVar22->_M_string_length);
            if (((char *)local_148._M_string_length == (char *)0x0) ||
               (lVar13 = std::__cxx11::string::find
                                   ((char *)&local_190,(ulong)local_148._M_dataplus._M_p,0),
               lVar13 != 0)) {
              if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
                strlen(pcVar11);
                lVar13 = std::__cxx11::string::find((char *)&local_190,(ulong)pcVar11,0);
                if (lVar13 == 0) {
                  strlen(pcVar11);
                  std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_190);
                  std::__cxx11::string::_M_assign((string *)&local_190);
                  std::__cxx11::string::append((char *)&local_190);
                  std::__cxx11::string::_M_append
                            ((char *)&local_190,(ulong)local_168._M_dataplus._M_p);
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_190);
                  goto LAB_0029b740;
                }
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_190);
              std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
LAB_0029b740:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
            }
            pVar24 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_118,&local_190);
            if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_128,&local_190);
            }
            goto LAB_0029b6ee;
          }
        }
      }
      else {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        pcVar4 = (pbVar22->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,pcVar4,pcVar4 + pbVar22->_M_string_length);
        if (((char *)local_148._M_string_length == (char *)0x0) ||
           (lVar13 = std::__cxx11::string::find
                               ((char *)&local_190,(ulong)local_148._M_dataplus._M_p,0), lVar13 != 0
           )) {
          if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
            strlen(pcVar11);
            lVar13 = std::__cxx11::string::find((char *)&local_190,(ulong)pcVar11,0);
            if (lVar13 == 0) {
              strlen(pcVar11);
              std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_190);
              std::__cxx11::string::_M_assign((string *)&local_190);
              std::__cxx11::string::append((char *)&local_190);
              std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_168._M_dataplus._M_p);
              cmsys::SystemTools::ConvertToUnixSlashes(&local_190);
              goto LAB_0029b636;
            }
          }
          if ((bVar10 != 0) &&
             ((bVar7 = cmsys::SystemTools::ComparePath(&local_190,local_120), bVar7 ||
              (bVar7 = cmsys::SystemTools::IsSubDirectory(&local_190,local_120), bVar7)))) {
            cmSystemTools::RelativePath(&local_168,&local_90,&local_190);
            std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_190._M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)&local_190);
            }
            else {
              local_d8[0] = &local_c8;
              pcVar4 = (local_e8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_d8,pcVar4,pcVar4 + local_e8->_M_string_length);
              std::__cxx11::string::append((char *)local_d8);
              plVar16 = (long *)std::__cxx11::string::_M_append
                                          ((char *)local_d8,(ulong)local_190._M_dataplus._M_p);
              psVar17 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_168.field_2._M_allocated_capacity = *psVar17;
                local_168.field_2._8_8_ = plVar16[3];
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              }
              else {
                local_168.field_2._M_allocated_capacity = *psVar17;
                local_168._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_168._M_string_length = plVar16[1];
              *plVar16 = (long)psVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              uVar19 = local_c8._M_allocated_capacity;
              _Var20._M_p = (pointer)local_d8[0];
              if (local_d8[0] != &local_c8) goto LAB_0029b6c1;
            }
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_190);
          std::__cxx11::string::operator=((string *)&local_190,(string *)&local_168);
LAB_0029b636:
          uVar19 = local_168.field_2._M_allocated_capacity;
          _Var20._M_p = local_168._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
LAB_0029b6c1:
            operator_delete(_Var20._M_p,uVar19 + 1);
          }
        }
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_118,&local_190);
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_128,&local_190);
        }
LAB_0029b6ee:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar5);
  }
  psVar14 = local_b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    psVar14 = local_b8;
  }
LAB_0029b7ae:
  pLVar15 = cmGeneratorTarget::GetLinkClosure(this->Target,psVar14);
  pbVar22 = (pLVar15->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pLVar15->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar5) {
    paVar1 = &local_190.field_2;
    do {
      std::operator+(&local_190,"CMAKE_",pbVar22);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_190);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar18 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_148.field_2._M_allocated_capacity = *puVar18;
        local_148.field_2._8_8_ = plVar16[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar18;
        local_148._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_148._M_string_length = plVar16[1];
      *plVar16 = (long)puVar18;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      bVar7 = cmMakefile::IsOn(this->Makefile,&local_148);
      if (bVar7) {
        std::operator+(&local_168,"CMAKE_",pbVar22);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_168);
        psVar17 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_190.field_2._M_allocated_capacity = *psVar17;
          local_190.field_2._8_8_ = plVar16[3];
          local_190._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar17;
          local_190._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_190._M_string_length = plVar16[1];
        *plVar16 = (long)psVar17;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        pcVar11 = cmMakefile::GetDefinition(this->Makefile,&local_190);
        if (pcVar11 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_128,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar5);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_128,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}